

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

Rule * Parser::getLCP(Rule *__return_storage_ptr__,Rule *a,Rule *b)

{
  pointer *ppNVar1;
  pointer pNVar2;
  iterator __position;
  pointer pNVar3;
  long lVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->rights).
      super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if ((((a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
        super__Vector_impl_data._M_finish) &&
      ((b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (pNVar3 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_start,
     (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
     super__Vector_impl_data._M_finish != pNVar3)) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pNVar2 = (b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 3) <= uVar5) {
        return __return_storage_ptr__;
      }
      if ((&pNVar3->isEnd)[lVar4] != (&pNVar2->isEnd)[lVar4]) {
        return __return_storage_ptr__;
      }
      if (*(int *)((long)&pNVar3->id + lVar4) != *(int *)((long)&pNVar2->id + lVar4)) {
        return __return_storage_ptr__;
      }
      __position._M_current =
           (__return_storage_ptr__->rights).
           super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->rights).
          super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Parser::Node,std::allocator<Parser::Node>>::
        _M_realloc_insert<Parser::Node_const&>
                  ((vector<Parser::Node,std::allocator<Parser::Node>> *)__return_storage_ptr__,
                   __position,(Node *)(&pNVar3->isEnd + lVar4));
      }
      else {
        *__position._M_current = *(Node *)(&pNVar3->isEnd + lVar4);
        ppNVar1 = &(__return_storage_ptr__->rights).
                   super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      pNVar3 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar5 < (ulong)((long)(a->rights).
                                   super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

Rule getLCP(const Rule& a,const Rule& b){
        Rule res;
        res.rights.clear();
        if(a.isNone()||b.isNone()) return res;
        for(int i = 0;i < a.rights.size() && i < b.rights.size();i++){
            if(a.rights[i] == b.rights[i]) res.rights.push_back(a.rights[i]);
            else break;
        }
        return res;
    }